

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_while::run_impl(statement_while *this)

{
  context_t *c;
  bool bVar1;
  element_type *peVar2;
  _Elt_pointer ppsVar3;
  bool *pbVar4;
  _Map_pointer pppsVar5;
  _Elt_pointer ppsVar6;
  _Elt_pointer ppsVar7;
  scope_guard scope;
  scope_guard sStack_a8;
  slot_type *local_98;
  
  peVar2 = (((this->super_statement_base).context.
             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->break_block == true) {
    peVar2->break_block = false;
  }
  c = &(this->super_statement_base).context;
  if (peVar2->continue_block == true) {
    peVar2->continue_block = false;
  }
  scope_guard::scope_guard(&sStack_a8,c);
  do {
    local_98 = (slot_type *)(this->mTree).mRoot;
    runtime_type::parse_expr
              ((runtime_type *)&stack0xffffffffffffff60,
               (iterator *)
               (((this->super_statement_base).context.
                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance)
               .super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               SUB81(&stack0xffffffffffffff68,0));
    pbVar4 = cs_impl::any::const_val<bool>((any *)&stack0xffffffffffffff60);
    bVar1 = *pbVar4;
    cs_impl::any::recycle((any *)&stack0xffffffffffffff60);
    if (bVar1 != true) {
LAB_002e6841:
      scope_guard::~scope_guard(&sStack_a8);
      return;
    }
    process_context::poll_event((process_context *)current_process);
    ppsVar7 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur;
    ppsVar6 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar5 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    ppsVar3 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    while (ppsVar7 != ppsVar3) {
      statement_base::run(*ppsVar7);
      peVar2 = (((c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2->return_fcall != false) goto LAB_002e6841;
      if (peVar2->break_block == true) {
        peVar2->break_block = false;
        goto LAB_002e6841;
      }
      if (peVar2->continue_block != false) {
        peVar2->continue_block = false;
        break;
      }
      ppsVar7 = ppsVar7 + 1;
      if (ppsVar7 == ppsVar6) {
        ppsVar7 = pppsVar5[1];
        pppsVar5 = pppsVar5 + 1;
        ppsVar6 = ppsVar7 + 0x40;
      }
    }
    scope_guard::clear(&sStack_a8);
  } while( true );
}

Assistant:

void statement_while::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		while (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			current_process->poll_event();
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}